

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long mkvparser::ParseElementHeader
               (IMkvReader *pReader,longlong *pos,longlong stop,longlong *id,longlong *size)

{
  long in_RAX;
  longlong lVar1;
  ulong uVar2;
  long pos_00;
  long lVar3;
  long len;
  
  if (stop < 0 || *pos < stop) {
    len = in_RAX;
    lVar1 = ReadID(pReader,*pos,&len);
    *id = lVar1;
    lVar3 = -2;
    if (-1 < lVar1) {
      pos_00 = *pos + len;
      *pos = pos_00;
      if (stop < 0 || pos_00 < stop) {
        lVar1 = ReadUInt(pReader,pos_00,&len);
        *size = lVar1;
        if ((0xfffffffffffffff7 < len - 9U && -1 < lVar1) && (uVar2 = len + *pos, -1 < (long)uVar2))
        {
          *pos = uVar2;
          lVar3 = (ulong)(uVar2 <= (ulong)stop) * 2 + -2;
        }
      }
    }
  }
  else {
    lVar3 = -2;
  }
  return lVar3;
}

Assistant:

long ParseElementHeader(IMkvReader* pReader, long long& pos, long long stop,
                        long long& id, long long& size) {
  if (stop >= 0 && pos >= stop)
    return E_FILE_FORMAT_INVALID;

  long len;

  id = ReadID(pReader, pos, len);

  if (id < 0)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume id

  if (stop >= 0 && pos >= stop)
    return E_FILE_FORMAT_INVALID;

  size = ReadUInt(pReader, pos, len);

  if (size < 0 || len < 1 || len > 8) {
    // Invalid: Negative payload size, negative or 0 length integer, or integer
    // larger than 64 bits (libwebm cannot handle them).
    return E_FILE_FORMAT_INVALID;
  }

  // Avoid rolling over pos when very close to LLONG_MAX.
  const unsigned long long rollover_check =
      static_cast<unsigned long long>(pos) + len;
  if (rollover_check > LLONG_MAX)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume length of size

  // pos now designates payload

  if (stop >= 0 && pos > stop)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}